

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O2

void __thiscall BackwardPass::InsertArgInsForFormals(BackwardPass *this)

{
  Func *this_00;
  code *pcVar1;
  bool bVar2;
  ArgSlot AVar3;
  uint16 uVar4;
  uint uVar5;
  JITTimeFunctionBody *pJVar6;
  undefined4 *puVar7;
  StackSym *stackSym;
  StackSym *sym;
  RegOpnd *dstOpnd;
  SymOpnd *src1Opnd;
  Instr *instr;
  char16 *pcVar8;
  ushort uVar9;
  Instr *this_01;
  ushort local_34;
  
  bVar2 = Func::IsStackArgsEnabled(this->func);
  if (bVar2) {
    pJVar6 = Func::GetJITFunctionBody(this->func);
    bVar2 = JITTimeFunctionBody::HasImplicitArgIns(pJVar6);
    if (!bVar2) {
      this_01 = this->func->m_headInstr->m_next;
      if ((this_01->m_kind != InstrKindLabel) && (this_01->m_kind != InstrKindProfiledLabel)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                           ,0x114,"(insertAfterInstr->IsLabelInstr())",
                           "First Instr of the first block should always have a label");
        if (!bVar2) {
LAB_003c0a4c:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar7 = 0;
      }
      pJVar6 = Func::GetJITFunctionBody(this_01->m_func);
      AVar3 = JITTimeFunctionBody::GetInParamsCount(pJVar6);
      local_34 = AVar3 - 1;
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      for (uVar9 = 1; uVar9 <= local_34; uVar9 = uVar9 + 1) {
        stackSym = StackSym::NewParamSlotSym(uVar9 + 1,this->func);
        sym = StackSym::New(this->func);
        dstOpnd = IR::RegOpnd::New(sym,TyVar,this->func);
        this_00 = this->func;
        uVar4 = LowererMD::GetFormalParamOffset();
        Func::SetArgOffset(this_00,stackSym,((uint)uVar4 + (uint)uVar9) * 8);
        src1Opnd = IR::SymOpnd::New(&stackSym->super_Sym,TyVar,this->func);
        instr = IR::Instr::New(ArgIn_A,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,this->func);
        IR::Instr::InsertAfter(this_01,instr);
        bVar2 = Func::HasStackSymForFormal(this->func,uVar9 - 1);
        if (bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *puVar7 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/BackwardPass.cpp"
                             ,0x127,"(!func->HasStackSymForFormal(argumentIndex - 1))",
                             "Already has a stack sym for this formal?");
          if (!bVar2) goto LAB_003c0a4c;
          *puVar7 = 0;
        }
        Func::TrackStackSymForFormalIndex(this->func,uVar9 - 1,sym);
        this_01 = instr;
      }
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01453738,StackArgFormalsOptPhase);
      if (((bVar2) && (AVar3 != 1)) && (DAT_0145948a != '\0')) {
        pJVar6 = Func::GetJITFunctionBody(this->func);
        pcVar8 = JITTimeFunctionBody::GetDisplayName(pJVar6);
        uVar5 = Func::GetFunctionNumber(this->func);
        Output::Print(L"StackArgFormals : %s (%d) :Inserting ArgIn_A for LdSlot (formals) in the start of Deadstore pass. \n"
                      ,pcVar8,(ulong)uVar5);
        Output::Flush();
        return;
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::InsertArgInsForFormals()
{
    if (func->IsStackArgsEnabled() && !func->GetJITFunctionBody()->HasImplicitArgIns())
    {
        IR::Instr * insertAfterInstr = func->m_headInstr->m_next;
        AssertMsg(insertAfterInstr->IsLabelInstr(), "First Instr of the first block should always have a label");

        Js::ArgSlot paramsCount = insertAfterInstr->m_func->GetJITFunctionBody()->GetInParamsCount() - 1;
        IR::Instr *     argInInstr = nullptr;
        for (Js::ArgSlot argumentIndex = 1; argumentIndex <= paramsCount; argumentIndex++)
        {
            IR::SymOpnd *   srcOpnd;
            StackSym *      symSrc = StackSym::NewParamSlotSym(argumentIndex + 1, func);
            StackSym *      symDst = StackSym::New(func);
            IR::RegOpnd * dstOpnd = IR::RegOpnd::New(symDst, TyVar, func);

            func->SetArgOffset(symSrc, (argumentIndex + LowererMD::GetFormalParamOffset()) * MachPtr);

            srcOpnd = IR::SymOpnd::New(symSrc, TyVar, func);

            argInInstr = IR::Instr::New(Js::OpCode::ArgIn_A, dstOpnd, srcOpnd, func);
            insertAfterInstr->InsertAfter(argInInstr);
            insertAfterInstr = argInInstr;

            AssertMsg(!func->HasStackSymForFormal(argumentIndex - 1), "Already has a stack sym for this formal?");
            this->func->TrackStackSymForFormalIndex(argumentIndex - 1, symDst);
        }

        if (PHASE_VERBOSE_TRACE1(Js::StackArgFormalsOptPhase) && paramsCount > 0)
        {
            Output::Print(_u("StackArgFormals : %s (%d) :Inserting ArgIn_A for LdSlot (formals) in the start of Deadstore pass. \n"), func->GetJITFunctionBody()->GetDisplayName(), func->GetFunctionNumber());
            Output::Flush();
        }
    }
}